

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflectionTraverser::addUniform(TReflectionTraverser *this,TIntermSymbol *base)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  iterator local_c0;
  const_iterator local_b8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_b0;
  TString *blockName;
  undefined1 local_a0 [7];
  bool anonymous;
  TString baseName;
  TList<glslang::TIntermBinary_*> derefs;
  int offset;
  int blockIndex;
  TIntermSymbol *local_40;
  _Self local_38;
  TIntermSymbol *local_30;
  _Self local_28;
  TIntermSymbol *local_20;
  TIntermSymbol *base_local;
  TReflectionTraverser *this_local;
  
  local_30 = base;
  local_20 = base;
  base_local = (TIntermSymbol *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
       ::find(&this->processedDerefs,(key_type *)&local_30);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
       ::end(&this->processedDerefs);
  bVar1 = std::operator==(&local_28,&local_38);
  if (bVar1) {
    local_40 = local_20;
    std::
    set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>::
    insert(&this->processedDerefs,(value_type *)&local_40);
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node._M_size._4_4_ = -1;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node._M_size._0_4_ = -1;
    TList<glslang::TIntermBinary_*>::TList
              ((TList<glslang::TIntermBinary_*> *)((long)&baseName.field_2 + 8));
    iVar2 = (*(local_20->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_a0,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(local_20->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x38))();
    if (iVar2 == 0x10) {
      derefs.
      super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
      super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
      ._M_impl._M_node._M_size._0_4_ = 0;
      blockName._7_1_ = IsAnonymous((TString *)local_a0);
      iVar2 = (*(local_20->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      local_b0 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))();
      if ((blockName._7_1_ & 1) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_a0,local_b0);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_a0,"");
      }
      name = local_b0;
      iVar2 = (*(local_20->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      iVar3 = (*(local_20->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      iVar3 = TIntermediate::getBlockSize((TType *)CONCAT44(extraout_var_03,iVar3));
      derefs.
      super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
      super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
      ._M_impl._M_node._M_size._4_4_ =
           addBlockName(this,name,(TType *)CONCAT44(extraout_var_02,iVar2),iVar3);
    }
    iVar2 = (*(local_20->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    local_c0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>::end
                   ((list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                     *)((long)&baseName.field_2 + 8));
    std::_List_const_iterator<glslang::TIntermBinary_*>::_List_const_iterator(&local_b8,&local_c0);
    iVar3 = (*(local_20->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    blowUpActiveAggregate
              (this,(TType *)CONCAT44(extraout_var_04,iVar2),(TString *)local_a0,
               (TList<glslang::TIntermBinary_*> *)((long)&baseName.field_2 + 8),local_b8,
               (int)derefs.
                    super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                    .
                    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                    ._M_impl._M_node._M_size,
               derefs.
               super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
               .
               super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
               ._M_impl._M_node._M_size._4_4_,0,-1,0,
               (TStorageQualifier)*(undefined8 *)(CONCAT44(extraout_var_05,iVar3) + 8) & 0x7f,
               (bool)(this->updateStageMasks & 1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_a0);
    TList<glslang::TIntermBinary_*>::~TList
              ((TList<glslang::TIntermBinary_*> *)((long)&baseName.field_2 + 8));
  }
  return;
}

Assistant:

void addUniform(const TIntermSymbol& base)
    {
        if (processedDerefs.find(&base) == processedDerefs.end()) {
            processedDerefs.insert(&base);

            int blockIndex = -1;
            int offset     = -1;
            TList<TIntermBinary*> derefs;
            TString baseName = base.getName();

            if (base.getType().getBasicType() == EbtBlock) {
                offset = 0;
                bool anonymous = IsAnonymous(baseName);
                const TString& blockName = base.getType().getTypeName();

                if (!anonymous)
                    baseName = blockName;
                else
                    baseName = "";

                blockIndex = addBlockName(blockName, base.getType(), intermediate.getBlockSize(base.getType()));
            }

            // Use a degenerate (empty) set of dereferences to immediately put as at the end of
            // the dereference change expected by blowUpActiveAggregate.
            blowUpActiveAggregate(base.getType(), baseName, derefs, derefs.end(), offset, blockIndex, 0, -1, 0,
                                    base.getQualifier().storage, updateStageMasks);
        }
    }